

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

int revnum(int x,int y,int d,char (*board) [8],STATE s,int f)

{
  int iVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  long lVar5;
  uint uVar6;
  long lVar7;
  uint uVar8;
  bool bVar9;
  
  iVar1 = dir[d][0];
  iVar2 = dir[d][1];
  uVar6 = iVar1 + x;
  uVar8 = iVar2 + y;
  iVar3 = 0;
  lVar5 = 0;
  while( true ) {
    if (7 < uVar6) {
      return 0;
    }
    if (7 < uVar8) break;
    if ((s == WHITE | WHITE) != (int)board[uVar6][uVar8]) {
      if ((int)board[uVar6][uVar8] == s) {
        if (f != 0) {
          pcVar4 = board[(long)x + (long)iVar1] + (long)y + (long)iVar2;
          lVar7 = lVar5;
          while (bVar9 = lVar7 != 0, lVar7 = lVar7 + -1, bVar9) {
            *pcVar4 = (char)s;
            pcVar4 = pcVar4 + (long)iVar2 + (long)iVar1 * 8;
          }
        }
        iVar3 = (int)lVar5;
      }
      return iVar3;
    }
    uVar6 = uVar6 + iVar1;
    uVar8 = uVar8 + iVar2;
    lVar5 = lVar5 + 1;
  }
  return 0;
}

Assistant:

int revnum(int x, int y, int d, char board[][SIZE], STATE s, int f) {
    int x0 = x, y0 = y;
    int a = dir[d][0], b = dir[d][1];
    int num = 0, flag = 0;
    STATE rs = (s == WHITE ? BLACK : WHITE);
    x += a;
    y += b;
    while (x >= 0 && x < SIZE && y >= 0 && y < SIZE) {
        if (board[x][y] == rs) {
            num++;
        } else if (board[x][y] == s) {
            flag = 1;
            break;
        } else {
            break;
        }
        x += a;
        y += b;
    }
    if (flag) {
        if (f) {
            int k;
            for (k = 1; k <= num; k++) {
                x = x0 + a * k;
                y = y0 + b * k;
                board[x][y] = s;
            }
        }
        return num;
    }
    return 0;
}